

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_>::~list
          (list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this)

{
  clear(this);
  listTerminate(this);
  return;
}

Assistant:

~list() {
		this->clear();
		this->listTerminate();
	}